

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  int iVar1;
  CURLcode CVar2;
  FILE *__stream;
  _Bool local_81;
  stsentry *psStack_80;
  _Bool stop;
  stsentry *sts_1;
  curl_index i;
  stsentry *sts;
  uchar randsuffix [9];
  char *tempstore;
  FILE *out;
  CURLcode result;
  Curl_llist_element *n;
  Curl_llist_element *e;
  char *file_local;
  hsts *h_local;
  Curl_easy *data_local;
  
  out._4_4_ = CURLE_OK;
  if (h == (hsts *)0x0) {
    return CURLE_OK;
  }
  e = (Curl_llist_element *)file;
  if ((file == (char *)0x0) && (h->filename != (char *)0x0)) {
    e = (Curl_llist_element *)h->filename;
  }
  if ((((h->flags & 2) == 0) && (e != (Curl_llist_element *)0x0)) && (*(char *)&e->ptr != '\0')) {
    CVar2 = Curl_rand_hex(data,(uchar *)((long)&sts + 7),9);
    if (CVar2 != CURLE_OK) {
      return CURLE_FAILED_INIT;
    }
    randsuffix._1_8_ = curl_maprintf("%s.%s.tmp",e,(long)&sts + 7);
    if ((char *)randsuffix._1_8_ == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    __stream = fopen64((char *)randsuffix._1_8_,"w");
    if (__stream == (FILE *)0x0) {
      out._4_4_ = CURLE_WRITE_ERROR;
    }
    else {
      fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
            ,__stream);
      n = (h->list).head;
      do {
        if (n == (Curl_llist_element *)0x0) break;
        i.total = (size_t)n->ptr;
        n = n->next;
        out._4_4_ = hsts_out((stsentry *)i.total,(FILE *)__stream);
      } while (out._4_4_ == CURLE_OK);
      fclose(__stream);
      if ((out._4_4_ == CURLE_OK) &&
         (iVar1 = Curl_rename((char *)randsuffix._1_8_,(char *)e), iVar1 != 0)) {
        out._4_4_ = CURLE_WRITE_ERROR;
      }
      if (out._4_4_ != CURLE_OK) {
        unlink((char *)randsuffix._1_8_);
      }
    }
    (*Curl_cfree)((void *)randsuffix._1_8_);
  }
  if ((data->set).hsts_write != (curl_hstswrite_callback)0x0) {
    i.index = (h->list).size;
    sts_1 = (stsentry *)0x0;
    n = (h->list).head;
    while (n != (Curl_llist_element *)0x0) {
      psStack_80 = (stsentry *)n->ptr;
      n = n->next;
      CVar2 = hsts_push(data,(curl_index *)&sts_1,psStack_80,&local_81);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      if ((local_81 & 1U) != 0) {
        return CURLE_OK;
      }
      sts_1 = (stsentry *)((long)&(sts_1->node).ptr + 1);
      out._4_4_ = CURLE_OK;
    }
  }
  return out._4_4_;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore;
  unsigned char randsuffix[9];

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length file name */
    goto skipsave;

  if(Curl_rand_hex(data, randsuffix, sizeof(randsuffix)))
    return CURLE_FAILED_INIT;

  tempstore = aprintf("%s.%s.tmp", file, randsuffix);
  if(!tempstore)
    return CURLE_OUT_OF_MEMORY;

  out = fopen(tempstore, FOPEN_WRITETEXT);
  if(!out)
    result = CURLE_WRITE_ERROR;
  else {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result)
      unlink(tempstore);
  }
  free(tempstore);
  skipsave:
  if(data->set.hsts_write) {
    /* if there's a write callback */
    struct curl_index i; /* count */
    i.total = h->list.size;
    i.index = 0;
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      bool stop;
      n = e->next;
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}